

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonengine.cpp
# Opt level: O2

void __thiscall banksia::JsonEngine::JsonEngine(JsonEngine *this,Config *config)

{
  _Rb_tree_header *p_Var1;
  Protocol PVar2;
  
  Engine::Engine(&this->super_Engine,config);
  (this->super_Engine).super_Player.super_Obj._vptr_Obj = (_func_int **)&PTR__JsonEngine_001ac730;
  (this->super_Engine).super_Player.super_Tickable._vptr_Tickable =
       (_func_int **)&PTR__JsonEngine_001ac858;
  this->jsonstate = none;
  *(undefined8 *)&(this->taskComplete).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->taskComplete).super__Function_base._M_functor + 8) = 0;
  (this->taskComplete).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->taskComplete)._M_invoker = (_Invoker_type)0x0;
  this->tick_test_period = 0x18;
  this->tick_test_period_wb = 0x32;
  this->tick_test = 0;
  this->tryNum = 3;
  this->engine = (Engine *)0x0;
  UciEngine::UciEngine(&this->uciEngine);
  WbEngine::WbEngine(&this->wbEngine);
  p_Var1 = &(this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header;
  (this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  PVar2 = config->protocol;
  this->originalProtocol = PVar2;
  if (PVar2 == none) {
    (this->super_Engine).config.protocol = uci;
  }
  return;
}

Assistant:

JsonEngine::JsonEngine(const Config& config)
: Engine(config)
{
    assert(!config.command.empty());
    
    originalProtocol = config.protocol;
    if (config.protocol == Protocol::none) {
        this->config.protocol = Protocol::uci;
    }
}